

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

errr finish_parse_brand(parser *p)

{
  brand *pbVar1;
  errr local_28;
  int local_24;
  errr result;
  wchar_t count;
  brand *next;
  brand *brand;
  parser *p_local;
  
  local_24 = 1;
  local_28 = 0;
  z_info->brand_max = '\0';
  next = (brand *)parser_priv(p);
  do {
    if (next == (brand *)0x0) {
LAB_001b79e3:
      brands = (brand_conflict *)mem_zalloc((long)(int)(z_info->brand_max + 1) * 0x38);
      next = (brand *)parser_priv(p);
      while (next != (brand *)0x0) {
        pbVar1 = next->next;
        if (local_24 <= (int)(uint)z_info->brand_max) {
          memcpy(brands + local_24,next,0x38);
          brands[local_24].next = (brand_conflict *)0x0;
        }
        mem_free(next);
        local_24 = local_24 + 1;
        next = pbVar1;
      }
      z_info->brand_max = z_info->brand_max + '\x01';
      parser_destroy(p);
      return local_28;
    }
    if (0xfd < z_info->brand_max) {
      local_28 = 0x33;
      goto LAB_001b79e3;
    }
    z_info->brand_max = z_info->brand_max + '\x01';
    next = next->next;
  } while( true );
}

Assistant:

static errr finish_parse_brand(struct parser *p) {
	struct brand *brand, *next = NULL;
	int count = 1;
	errr result = PARSE_ERROR_NONE;

	/* Count the entries */
	z_info->brand_max = 0;
	brand = parser_priv(p);
	while (brand) {
		if (z_info->brand_max >= 254) {
			result = PARSE_ERROR_TOO_MANY_ENTRIES;
			break;
		}
		z_info->brand_max++;
		brand = brand->next;
	}

	/* Allocate the direct access list and copy the data to it */
	brands = mem_zalloc((z_info->brand_max + 1) * sizeof(*brand));
	for (brand = parser_priv(p); brand; brand = next, count++) {
		next = brand->next;
		if (count <= z_info->brand_max) {
			memcpy(&brands[count], brand, sizeof(*brand));
			brands[count].next = NULL;
		}
		mem_free(brand);
	}
	z_info->brand_max += 1;

	parser_destroy(p);
	return result;
}